

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

ON_SubDVertex * __thiscall
ON_SubDRTree::FindMarkedVertexAtPoint(ON_SubDRTree *this,ON_3dPoint P,double distance_tolerance)

{
  ON_BoundingBox rbox;
  ON_3dVector rtol;
  ON_RTreeBBox local_e8;
  ON_RTreeSearchResultCallback local_b8;
  ON_BoundingBox local_a8;
  ON_3dPoint local_78;
  double local_60;
  ON_SubDVertex *local_58;
  undefined8 uStack_50;
  ON_3dVector local_40;
  
  local_60 = ON_DBL_QNAN;
  local_78.x = P.x;
  local_78.y = P.y;
  local_78.z = P.z;
  local_58 = (ON_SubDVertex *)0x0;
  uStack_50 = 1;
  ON_BoundingBox::ON_BoundingBox(&local_a8);
  ON_3dVector::ON_3dVector(&local_40,distance_tolerance,distance_tolerance,distance_tolerance);
  ON_3dPoint::operator-((ON_3dPoint *)&local_e8,&local_78,&local_40);
  local_a8.m_min.z = local_e8.m_min[2];
  local_a8.m_min.x = local_e8.m_min[0];
  local_a8.m_min.y = local_e8.m_min[1];
  ON_3dPoint::operator+((ON_3dPoint *)&local_e8,&local_78,&local_40);
  local_e8.m_max[2] = local_e8.m_min[2];
  local_e8.m_max[1] = local_e8.m_min[1];
  local_e8.m_max[0] = local_e8.m_min[0];
  local_a8.m_max.z = local_e8.m_min[2];
  local_a8.m_max.x = local_e8.m_min[0];
  local_a8.m_max.y = local_e8.m_min[1];
  if (*(ON_RTreeNode **)this != (ON_RTreeNode *)0x0) {
    local_e8.m_min[2] = local_a8.m_min.z;
    local_e8.m_min[0] = local_a8.m_min.x;
    local_e8.m_min[1] = local_a8.m_min.y;
    local_b8.m_resultCallback = ON_SubDRTreeVertexFinder::Callback;
    local_b8.m_context = &local_78;
    SearchHelper(*(ON_RTreeNode **)this,&local_e8,&local_b8);
  }
  return local_58;
}

Assistant:

const ON_SubDVertex* ON_SubDRTree::FindMarkedVertexAtPoint(
  const ON_3dPoint P,
  const double distance_tolerance
) const
{
  ON_SubDRTreeVertexFinder vf;
  vf = ON_SubDRTreeVertexFinder::Create(P, false);

  ON_BoundingBox rbox;
  const ON_3dVector rtol(distance_tolerance, distance_tolerance, distance_tolerance);

  rbox.m_min = vf.m_P - rtol;
  rbox.m_max = vf.m_P + rtol;
  // vtree.Search() can return true (found nearby) and false (found exact) because 
  // ON_SubDRTreeVertexFinder::Callback() cancels the search when a vertex at the exact location
  // is found.
  this->Search(&rbox.m_min.x, &rbox.m_max.x, ON_SubDRTreeVertexFinder::Callback, &vf);
  return vf.m_v;
}